

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall
helics::apps::Recorder::addSourceEndpointClone(Recorder *this,string_view sourceEndpoint)

{
  string_view endpoint;
  bool bVar1;
  element_type *peVar2;
  Interface *in_RDX;
  char (*in_RSI) [7];
  Interface *in_RDI;
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
  *in_stack_ffffffffffffff98;
  unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
  *in_stack_ffffffffffffffb0;
  __sv_type in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffd0;
  Interface *__args;
  InterfaceType hint;
  
  __args = in_RDI;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
                      *)0x3f29d9);
  if (!bVar1) {
    CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)
               &in_RDI->mCore);
    std::make_unique<helics::CloningFilter,helics::CombinationFederate*>
              ((CombinationFederate **)__args);
    CLI::std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::
    operator=((unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *)
              in_RDI,in_stack_ffffffffffffff98);
    std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::~unique_ptr
              (in_stack_ffffffffffffffb0);
    peVar2 = CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)
                        &in_RDI->mCore);
    std::make_unique<helics::Endpoint,helics::CombinationFederate*,char_const(&)[7]>
              ((CombinationFederate **)in_RDX,in_RSI);
    CLI::std::unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_>::operator=
              ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)in_RDI,
               (unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)
               in_stack_ffffffffffffff98);
    CLI::std::unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_>::~unique_ptr
              ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)in_RDI);
    std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::operator->
              ((unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *)
               0x3f2a7d);
    CLI::std::unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_>::operator->
              ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)0x3f2a92);
    Interface::getName_abi_cxx11_(in_RDI);
    in_stack_ffffffffffffffb8 =
         std::__cxx11::string::operator_cast_to_basic_string_view
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    endpoint._M_str = in_stack_ffffffffffffffd0;
    endpoint._M_len = (size_t)peVar2;
    CloningFilter::addDeliveryEndpoint((CloningFilter *)in_stack_ffffffffffffffb8._M_str,endpoint);
  }
  hint = (InterfaceType)((ulong)in_RSI >> 0x38);
  std::unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>::operator->
            ((unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *)
             0x3f2ad0);
  Interface::addSourceTarget(in_RDX,in_stack_ffffffffffffffb8,hint);
  return;
}

Assistant:

void Recorder::addSourceEndpointClone(std::string_view sourceEndpoint)
{
    if (!cFilt) {
        cFilt = std::make_unique<CloningFilter>(fed.get());
        cloneEndpoint = std::make_unique<Endpoint>(fed.get(), "cloneE");
        cFilt->addDeliveryEndpoint(cloneEndpoint->getName());
    }
    cFilt->addSourceTarget(sourceEndpoint);
}